

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

void test_seq_co(void)

{
  int iVar1;
  clock_t cVar2;
  clock_t cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double local_c48;
  dsfmt_t local_c38;
  
  dsfmt_chk_init_gen_rand(&local_c38,0x4d2,0x4de1);
  local_c48 = 0.0;
  lVar7 = 0;
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    cVar2 = clock();
    for (iVar5 = 0; iVar5 != 2000; iVar5 = iVar5 + 1) {
      iVar6 = 50000;
      while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
        iVar1 = local_c38.idx;
        if (0x17d < local_c38.idx) {
          dsfmt_gen_rand_all(&local_c38);
          iVar1 = 0;
        }
        local_c38.idx = iVar1 + 1;
        local_c48 = local_c48 + local_c38.status[0].d[iVar1] + -1.0;
      }
    }
    cVar3 = clock();
    lVar7 = (lVar7 - cVar2) + cVar3;
  }
  lVar8 = 0;
  printf("ST SEQ [0, 1) 1 AVE:%4lums.\n",(ulong)(lVar7 * 100) / 1000000,
         (ulong)(lVar7 * 100) % 1000000);
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    cVar2 = clock();
    for (iVar5 = 0; iVar5 != 2000; iVar5 = iVar5 + 1) {
      for (lVar7 = 0; lVar7 != 400000; lVar7 = lVar7 + 8) {
        iVar6 = local_c38.idx;
        if (0x17d < local_c38.idx) {
          dsfmt_gen_rand_all(&local_c38);
          iVar6 = 0;
        }
        local_c38.idx = iVar6 + 1;
        *(double *)((long)dummy + lVar7) = local_c38.status[0].d[iVar6] + -1.0;
      }
    }
    cVar3 = clock();
    lVar8 = (lVar8 - cVar2) + cVar3;
  }
  for (lVar7 = 0; lVar7 != 400000; lVar7 = lVar7 + 8) {
    local_c48 = local_c48 + *(double *)((long)dummy + lVar7);
  }
  printf("ST SEQ [0, 1) 2 AVE:%4lums.\n",(ulong)(lVar8 * 100) / 1000000,
         (ulong)(lVar8 * 100) % 1000000);
  printf("total = %f\n",local_c48);
  return;
}

Assistant:

static void test_seq_co(void) {
    uint32_t i, j, k;
    uint64_t clo;
    uint64_t sum;
    double *array = (double *)dummy;
    double r;
    double total = 0;
    dsfmt_t dsfmt;
#if 0
    dsfmt_gv_init_gen_rand(1234);
    sum = 0;
    r = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    for (k = 0; k < NUM_RANDS; k++) {
		r += dsfmt_gv_genrand_close_open();
	    }
	}
	clo = clock() - clo;
	sum += clo;
    }
    total = r;
    printf("GL SEQ [0, 1) 1 AVE:%4" PRIu64"ms.\n",
	   (sum * 100)  / CLOCKS_PER_SEC);

    sum = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    for (k = 0; k < NUM_RANDS; k++) {
		array[k] = dsfmt_gv_genrand_close_open();
	    }
	}
	clo = clock() - clo;
	sum += clo;
    }
    for (k = 0; k < NUM_RANDS; k++) {
	total += array[k];
    }
    printf("GL SEQ [0, 1) 2 AVE:%4" PRIu64"ms.\n",
	   (sum * 100)  / CLOCKS_PER_SEC);
#endif
    dsfmt_init_gen_rand(&dsfmt, 1234);
    sum = 0;
    r = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            for (k = 0; k < NUM_RANDS; k++) {
                r += dsfmt_genrand_close_open(&dsfmt);
            }
        }
        clo = clock() - clo;
        sum += clo;
    }
    total = r;
    printf("ST SEQ [0, 1) 1 AVE:%4" PRIu64"ms.\n",
           (sum * 100)  / CLOCKS_PER_SEC);

    sum = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            for (k = 0; k < NUM_RANDS; k++) {
                array[k] = dsfmt_genrand_close_open(&dsfmt);
            }
        }
        clo = clock() - clo;
        sum += clo;
    }
    for (k = 0; k < NUM_RANDS; k++) {
        total += array[k];
    }
    printf("ST SEQ [0, 1) 2 AVE:%4" PRIu64"ms.\n",
           (sum * 100)  / CLOCKS_PER_SEC);

    printf("total = %f\n", total);
}